

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O1

void __thiscall Ui_MainWindow::retranslateUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QPushButton *pQVar1;
  QLabel *pQVar2;
  QArrayData *local_30 [3];
  
  QCoreApplication::translate((char *)local_30,"MainWindow","MainWindow",0);
  QWidget::setWindowTitle((QString *)MainWindow);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar1 = this->beginNewGameButton;
  QCoreApplication::translate((char *)local_30,"MainWindow","Begin new game",0);
  QAbstractButton::setText((QString *)pQVar1);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar2 = this->player1Label;
  QCoreApplication::translate((char *)local_30,"MainWindow","Player 1",0);
  QLabel::setText((QString *)pQVar2);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar2 = this->player1Score;
  QCoreApplication::translate((char *)local_30,"MainWindow","0",0);
  QLabel::setText((QString *)pQVar2);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar2 = this->player2Label;
  QCoreApplication::translate((char *)local_30,"MainWindow","Player 2",0);
  QLabel::setText((QString *)pQVar2);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar2 = this->player2Score;
  QCoreApplication::translate((char *)local_30,"MainWindow","0",0);
  QLabel::setText((QString *)pQVar2);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  return;
}

Assistant:

void retranslateUi(QMainWindow *MainWindow)
    {
        MainWindow->setWindowTitle(QCoreApplication::translate("MainWindow", "MainWindow", nullptr));
        beginNewGameButton->setText(QCoreApplication::translate("MainWindow", "Begin new game", nullptr));
        player1Label->setText(QCoreApplication::translate("MainWindow", "Player 1", nullptr));
        player1Score->setText(QCoreApplication::translate("MainWindow", "0", nullptr));
        player2Label->setText(QCoreApplication::translate("MainWindow", "Player 2", nullptr));
        player2Score->setText(QCoreApplication::translate("MainWindow", "0", nullptr));
    }